

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O2

string * __thiscall
fineftp::FtpSession::toAbsoluteFtpPath
          (string *__return_storage_ptr__,FtpSession *this,string *rel_or_abs_ftp_path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((rel_or_abs_ftp_path->_M_string_length == 0) ||
     (*(rel_or_abs_ftp_path->_M_dataplus)._M_p != '/')) {
    ::std::operator+(&local_70,&this->ftp_working_directory_,"/");
    ::std::operator+(&local_50,&local_70,rel_or_abs_ftp_path);
    Filesystem::cleanPath(&local_30,(string *)&local_50,false,'/');
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FtpSession::toAbsoluteFtpPath(const std::string& rel_or_abs_ftp_path) const
  {
    std::string absolute_ftp_path;

    if (!rel_or_abs_ftp_path.empty() && (rel_or_abs_ftp_path[0] == '/'))
    {
      absolute_ftp_path = rel_or_abs_ftp_path;
    }
    else
    {
      absolute_ftp_path = fineftp::Filesystem::cleanPath(ftp_working_directory_ + "/" + rel_or_abs_ftp_path, false, '/');
    }

    return absolute_ftp_path;
  }